

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O3

result * __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_baryonyx::none_observer>
::operator()(result *__return_storage_ptr__,
            solver_functor<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_baryonyx::none_observer>
            *this,vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *constraints,int variables,quadratic_cost_type<double> *original_costs,
            double cost_constant)

{
  FILE *theta;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  init_policy_type iVar4;
  context *this_00;
  context *ctx;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  rep rVar9;
  long lVar10;
  random_engine *rng;
  int iVar11;
  bit_array_impl *x_optimistic;
  bit_array_impl *x_pessimistic;
  int in_R9D;
  long lVar12;
  double dVar13;
  double dVar14;
  undefined1 extraout_var [56];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  double ret;
  compute_order compute;
  solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
  slv;
  double local_1a0;
  bit_array_impl local_188;
  double local_178;
  quadratic_cost_type<double> *local_170;
  double local_168;
  int local_15c;
  bit_array_impl local_158;
  double local_140;
  double local_138;
  double local_130;
  quadratic_cost_type<double> local_128;
  double local_108;
  double local_100;
  long local_f8;
  compute_order local_f0;
  solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
  local_b8;
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->duration = 0.0;
  __return_storage_ptr__->loop = 0;
  __return_storage_ptr__->variables = 0;
  __return_storage_ptr__->constraints = 0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->method)._M_len = 0;
  (__return_storage_ptr__->method)._M_str = (char *)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  __return_storage_ptr__->remaining_constraints = 0x7fffffff;
  __return_storage_ptr__->annoying_variable = 0;
  __return_storage_ptr__->status = uninitialized;
  local_168 = cost_constant;
  bit_array_impl::bit_array_impl(&local_188,variables);
  this_00 = this->m_ctx;
  normalize_costs<double,baryonyx::itm::quadratic_cost_type<double>>
            (&local_128,(itm *)this_00,(context *)original_costs,
             (quadratic_cost_type<double> *)this->m_rng,(random_engine *)(ulong)(uint)variables,
             in_R9D);
  local_138 = (this_00->parameters).kappa_step;
  local_178 = (this_00->parameters).delta;
  local_130 = (this_00->parameters).kappa_max;
  local_140 = (this_00->parameters).alpha;
  theta = (FILE *)(this_00->parameters).theta;
  if (local_178 < 0.0) {
    ctx = this->m_ctx;
    local_b8.super_debug_logger<true>.ofs = theta;
    info<>(ctx,"  - delta not defined, compute it:\n");
    auVar20._0_8_ = (pointer)quadratic_cost_type<double>::min(&local_128,variables);
    auVar20._8_56_ = extraout_var;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = theta;
    auVar1 = vfnmadd132sd_fma(auVar20._0_16_,auVar20._0_16_,auVar1);
    local_158._0_8_ = auVar1._0_8_;
    local_f0.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = auVar20._0_8_;
    info<double,double,double>
              (ctx,"    - delta={} (min normalized cost:{} / theta: {})\n",(double *)&local_158,
               (double *)&local_f0,(double *)&local_b8);
    local_178 = (double)local_158._0_8_;
  }
  local_f8 = (long)(this_00->parameters).w;
  local_100 = (this_00->parameters).pushing_k_factor;
  local_108 = (this_00->parameters).pushing_objective_amplifier;
  solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
  ::solver_equalities_101coeff
            (&local_b8,this->m_rng,
             (int)((ulong)((long)(constraints->
                                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(constraints->
                                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333,
             variables,&local_128,constraints);
  compute_order::compute_order(&local_f0,(this_00->parameters).order,variables);
  dVar14 = (this->m_ctx->parameters).init_policy_random;
  local_158._0_8_ = 0.0;
  local_158.m_data._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
       (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0;
  iVar4 = (this_00->parameters).init_policy;
  local_15c = variables;
  if (iVar4 == bastert) {
    init_with_bastert<baryonyx::itm::quadratic_cost_type<double>,baryonyx::itm::minimize_tag>
              ((bit_array *)&local_188,original_costs,variables,0);
  }
  else {
    if (iVar4 == pessimistic_solve) {
      rng = this->m_rng;
      x_pessimistic = &local_188;
      x_optimistic = &local_158;
    }
    else {
      if (iVar4 != optimistic_solve) goto LAB_0030b79c;
      rng = this->m_rng;
      x_pessimistic = &local_158;
      x_optimistic = &local_188;
    }
    init_with_pre_solve<baryonyx::itm::quadratic_cost_type<double>,baryonyx::itm::minimize_tag>
              ((bit_array *)x_pessimistic,(bit_array *)x_optimistic,rng,original_costs,constraints,
               1.0);
  }
LAB_0030b79c:
  local_170 = original_costs;
  if (local_188.m_size != 0) {
    iVar11 = 0;
    do {
      dVar13 = std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (this->m_rng);
      if (dVar13 < dVar14) {
        bit_array_impl::invert(&local_188,iVar11);
      }
      iVar11 = iVar11 + 1;
    } while (local_188.m_size != iVar11);
  }
  if (local_158.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0) {
    operator_delete__((void *)local_158.m_data._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  local_1a0 = (this_00->parameters).kappa_min;
  rVar9 = std::chrono::_V2::steady_clock::now();
  (this->m_begin).__d.__r = rVar9;
  rVar9 = std::chrono::_V2::steady_clock::now();
  (this->m_end).__d.__r = rVar9;
  compute_order::
  init<baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,baryonyx::bit_array>
            (&local_f0,&local_b8,(bit_array *)&local_188);
  if ((this_00->parameters).limit != 0) {
    iVar11 = 0x7fffffff;
    lVar12 = 0;
    while( true ) {
      iVar6 = compute_order::
              run<baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,baryonyx::bit_array,double>
                        (&local_f0,&local_b8,(bit_array *)&local_188,this->m_rng,local_1a0,local_178
                         ,(double)theta);
      if (iVar6 == 0) {
        dVar14 = quadratic_cost_type<double>::results(local_170,(bit_array *)&local_188,local_168);
        store_if_better(this,(bit_array *)&local_188,dVar14,lVar12);
        auVar20 = ZEXT864((ulong)local_1a0);
        if ((this_00->parameters).pushes_limit < 1) goto LAB_0030b92b;
        iVar11 = 0;
        iVar6 = 0;
        goto LAB_0030ba77;
      }
      if (iVar6 < iVar11) {
        store_if_better(this,(bit_array *)&local_188,iVar6,lVar12);
        iVar11 = iVar6;
      }
      if (local_f8 < lVar12) {
        auVar15._0_8_ = pow((double)iVar6 / (double)local_b8.m,local_140);
        auVar15._8_56_ = extraout_var_00;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = local_1a0;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_138;
        auVar1 = vfmadd231sd_fma(auVar17,auVar15._0_16_,auVar2);
        local_1a0 = auVar1._0_8_;
      }
      if (local_130 < local_1a0) break;
      lVar10 = std::chrono::_V2::steady_clock::now();
      (this->m_end).__d.__r = lVar10;
      dVar14 = (this->m_ctx->parameters).time_limit;
      if (((0.0 < dVar14) && (dVar14 < (double)(lVar10 - (this->m_begin).__d.__r) / 1000000000.0))
         || (lVar12 = lVar12 + 1, lVar12 == (this_00->parameters).limit)) break;
    }
  }
  __return_storage_ptr__->status = limit_reached;
LAB_0030b92b:
  if ((this->m_best).remaining_constraints == 0) {
    __return_storage_ptr__->status = success;
  }
  if ((this->m_best).x.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
              (&__return_storage_ptr__->solutions,1);
    convert<baryonyx::itm::minimize_tag>
              (&this->m_best,
               (__return_storage_ptr__->solutions).
               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
               super__Vector_impl_data._M_start,local_15c);
  }
  if (local_f0.m_order.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.m_order.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f0.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f0.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
  ::~solver_equalities_101coeff(&local_b8);
  if ((__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
      local_128.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl != (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)0x0) {
    operator_delete__((void *)local_128.indices._M_t.
                              super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                              super__Head_base<0UL,_int_*,_false>._M_head_impl);
  }
  local_128.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                 (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)0x0;
  if ((tuple<baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
       )local_128.quadratic_elements._M_t.
        super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
        .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>.
        _M_head_impl !=
      (_Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>)0x0) {
    operator_delete__((void *)local_128.quadratic_elements._M_t.
                              super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                              .
                              super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                              ._M_head_impl);
  }
  local_128.quadratic_elements._M_t.
  super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
  .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>._M_head_impl =
       (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
        )(__uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
          )0x0;
  if ((_Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>)
      local_128.linear_elements._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
      _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl != (double *)0x0) {
    operator_delete__((void *)local_128.linear_elements._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
  }
  if ((_Head_base<0UL,_unsigned_long_*,_false>)
      local_188.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
    operator_delete__((void *)local_188.m_data._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  return __return_storage_ptr__;
LAB_0030ba77:
  do {
    iVar7 = compute_order::
            push_and_run<baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,baryonyx::bit_array,double>
                      (&local_f0,&local_b8,(bit_array *)&local_188,this->m_rng,
                       auVar20._0_8_ * local_100,local_178,(double)theta,local_108);
    if (iVar7 == 0) {
      dVar14 = quadratic_cost_type<double>::results(local_170,(bit_array *)&local_188,local_168);
      store_if_better(this,(bit_array *)&local_188,dVar14,
                      (long)~((this_00->parameters).pushing_iteration_limit * iVar6));
    }
    lVar12 = std::chrono::_V2::steady_clock::now();
    (this->m_end).__d.__r = lVar12;
    auVar20 = ZEXT864((ulong)auVar20._0_8_);
    dVar14 = (this->m_ctx->parameters).time_limit;
    if ((0.0 < dVar14) && (dVar14 < (double)(lVar12 - (this->m_begin).__d.__r) / 1000000000.0))
    break;
    if (0 < (this_00->parameters).pushing_iteration_limit) {
      iVar7 = 1;
      do {
        auVar18._0_8_ = auVar20._0_8_;
        iVar8 = compute_order::
                run<baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,baryonyx::bit_array,double>
                          (&local_f0,&local_b8,(bit_array *)&local_188,this->m_rng,auVar18._0_8_,
                           local_178,(double)theta);
        if (iVar8 == 0) {
          dVar14 = quadratic_cost_type<double>::results(local_170,(bit_array *)&local_188,local_168)
          ;
          store_if_better(this,(bit_array *)&local_188,dVar14,
                          (long)((this_00->parameters).pushing_iteration_limit * iVar11 - iVar7));
          auVar20 = ZEXT864((ulong)auVar18._0_8_);
          break;
        }
        if ((double)(iVar7 + -1) <= (this_00->parameters).w) {
          auVar19._8_8_ = 0;
          auVar19._0_8_ = auVar18._0_8_;
        }
        else {
          auVar16._0_8_ = pow((double)iVar8 / (double)local_b8.m,local_140);
          auVar16._8_56_ = extraout_var_01;
          auVar18._8_8_ = 0;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_138;
          auVar19 = vfmadd231sd_fma(auVar18,auVar16._0_16_,auVar3);
        }
        auVar20 = ZEXT1664(auVar19);
        dVar14 = auVar19._0_8_;
        if (local_130 < dVar14) break;
        lVar12 = std::chrono::_V2::steady_clock::now();
        (this->m_end).__d.__r = lVar12;
        dVar13 = (this->m_ctx->parameters).time_limit;
        if ((0.0 < dVar13) && (dVar13 < (double)(lVar12 - (this->m_begin).__d.__r) / 1000000000.0))
        {
          auVar20 = ZEXT864((ulong)dVar14);
          break;
        }
        auVar20 = ZEXT864((ulong)dVar14);
        bVar5 = iVar7 < (this_00->parameters).pushing_iteration_limit;
        iVar7 = iVar7 + 1;
      } while (bVar5);
    }
    iVar6 = iVar6 + 1;
    iVar11 = iVar11 + -1;
  } while (iVar6 < (this_00->parameters).pushes_limit);
  goto LAB_0030b92b;
}

Assistant:

result operator()(const std::vector<merged_constraint>& constraints,
                      int variables,
                      const Cost& original_costs,
                      double cost_constant)
    {
        result r;

        bit_array x(variables);

        int best_remaining = INT_MAX;

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const long int w_limit = static_cast<long int>(p.w);

        Solver slv(
          m_rng, length(constraints), variables, norm_costs, constraints);

        compute_order compute(p.order, variables);

        {
            std::bernoulli_distribution choose_mutation(
              m_ctx.parameters.init_policy_random);
            bit_array empty_x;

            switch (p.init_policy) {
            case solver_parameters::init_policy_type::pessimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  x, empty_x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::optimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  empty_x, x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::bastert:
                init_with_bastert<Cost, Mode>(x, original_costs, variables, 0);
                break;
            }

            for (int i = 0, e = x.size(); i != e; ++i)
                if (choose_mutation(m_rng))
                    x.invert(i);
        }

        bool start_push = false;
        auto kappa = static_cast<Float>(p.kappa_min);

        Observer obs("img", slv.m, slv.n, p.limit);

        m_begin = std::chrono::steady_clock::now();
        m_end = std::chrono::steady_clock::now();

        compute.init(slv, x);

        for (long int i = 0; i != p.limit; ++i) {
            auto remaining = compute.run(slv, x, m_rng, kappa, delta, theta);
            obs.make_observation(slv.ap, slv.P.get(), slv.pi.get());

            if (remaining == 0) {
                store_if_better(
                  x, original_costs.results(x, cost_constant), i);
                best_remaining = remaining;
                start_push = true;
                break;
            }

            if (remaining < best_remaining) {
                store_if_better(x, remaining, i);
                best_remaining = remaining;
            }

            if (i > w_limit)
                kappa += kappa_step * std::pow(static_cast<Float>(remaining) /
                                                 static_cast<Float>(slv.m),
                                               alpha);

            if (kappa > kappa_max) {
                r.status = result_status::kappa_max_reached;
                break;
            }

            if (is_timelimit_reached()) {
                r.status = result_status::time_limit_reached;
                break;
            }
        }

        if (!start_push) {
            r.status = result_status::limit_reached;
        } else {
            for (int push = 0; push < p.pushes_limit; ++push) {
                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_rng,
                                       pushing_k_factor * kappa,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0)
                    store_if_better(x,
                                    original_costs.results(x, cost_constant),
                                    -push * p.pushing_iteration_limit - 1);

                if (is_timelimit_reached())
                    break;

                for (int iter = 0; iter < p.pushing_iteration_limit; ++iter) {
                    remaining =
                      compute.run(slv, x, m_rng, kappa, delta, theta);

                    if (remaining == 0) {
                        store_if_better(
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;

                    if (is_timelimit_reached())
                        break;
                }
            }
        }

        if (m_best.remaining_constraints == 0)
            r.status = result_status::success;

        if (!m_best.x.empty()) {
            r.solutions.resize(1);
            convert(m_best, r.solutions[0], variables);
        }

        return r;
    }